

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_sig_alg_gets
              (char *buf,size_t size,mbedtls_x509_buf *sig_oid,mbedtls_pk_type_t pk_alg,
              mbedtls_md_type_t md_alg,void *sig_opts)

{
  int iVar1;
  uint uVar2;
  mbedtls_md_info_t *md_info;
  mbedtls_md_info_t *md_info_00;
  char *pcVar3;
  char *pcVar4;
  ulong __maxlen;
  ulong uVar5;
  char *desc;
  char *local_38;
  
  local_38 = (char *)0x0;
  iVar1 = mbedtls_oid_get_sig_alg_desc(sig_oid,&local_38);
  if (iVar1 == 0) {
    uVar2 = snprintf(buf,size,"%s",local_38);
  }
  else {
    uVar2 = snprintf(buf,size,"???");
  }
  iVar1 = -0x2980;
  if (-1 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
    __maxlen = size - uVar5;
    if (uVar5 <= size && __maxlen != 0) {
      if (pk_alg == MBEDTLS_PK_RSASSA_PSS) {
        md_info = mbedtls_md_info_from_type(md_alg);
        md_info_00 = mbedtls_md_info_from_type(*sig_opts);
        pcVar4 = "???";
        if (md_info != (mbedtls_md_info_t *)0x0) {
          pcVar4 = mbedtls_md_get_name(md_info);
        }
        pcVar3 = "???";
        if (md_info_00 != (mbedtls_md_info_t *)0x0) {
          pcVar3 = mbedtls_md_get_name(md_info_00);
        }
        uVar2 = snprintf(buf + uVar5,__maxlen," (%s, MGF1-%s, 0x%02X)",pcVar4,pcVar3,
                         (ulong)*(uint *)((long)sig_opts + 4));
        if (__maxlen <= uVar2 || (int)uVar2 < 0) {
          return -0x2980;
        }
        __maxlen = __maxlen - uVar2;
      }
      iVar1 = (int)size - (int)__maxlen;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_sig_alg_gets( char *buf, size_t size, const mbedtls_x509_buf *sig_oid,
                       mbedtls_pk_type_t pk_alg, mbedtls_md_type_t md_alg,
                       const void *sig_opts )
{
    int ret;
    char *p = buf;
    size_t n = size;
    const char *desc = NULL;

    ret = mbedtls_oid_get_sig_alg_desc( sig_oid, &desc );
    if( ret != 0 )
        ret = mbedtls_snprintf( p, n, "???"  );
    else
        ret = mbedtls_snprintf( p, n, "%s", desc );
    MBEDTLS_X509_SAFE_SNPRINTF;

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
    if( pk_alg == MBEDTLS_PK_RSASSA_PSS )
    {
        const mbedtls_pk_rsassa_pss_options *pss_opts;
        const mbedtls_md_info_t *md_info, *mgf_md_info;

        pss_opts = (const mbedtls_pk_rsassa_pss_options *) sig_opts;

        md_info = mbedtls_md_info_from_type( md_alg );
        mgf_md_info = mbedtls_md_info_from_type( pss_opts->mgf1_hash_id );

        ret = mbedtls_snprintf( p, n, " (%s, MGF1-%s, 0x%02X)",
                              md_info ? mbedtls_md_get_name( md_info ) : "???",
                              mgf_md_info ? mbedtls_md_get_name( mgf_md_info ) : "???",
                              pss_opts->expected_salt_len );
        MBEDTLS_X509_SAFE_SNPRINTF;
    }
#else
    ((void) pk_alg);
    ((void) md_alg);
    ((void) sig_opts);
#endif /* MBEDTLS_X509_RSASSA_PSS_SUPPORT */

    return( (int)( size - n ) );
}